

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

int fl_ready(void)

{
  int iVar1;
  undefined1 local_1a8 [8];
  fd_set fdt [3];
  undefined1 local_20 [8];
  timeval t;
  
  iVar1 = XQLength(fl_display);
  if (iVar1 == 0) {
    if (nfds == 0) {
      t.tv_usec._4_4_ = 0;
    }
    else {
      local_20 = (undefined1  [8])0x0;
      t.tv_sec = 0;
      memcpy(local_1a8,fdsets,0x80);
      memcpy(fdt[0].fds_bits + 0xf,fdsets + 1,0x80);
      memcpy(fdt[1].fds_bits + 0xf,fdsets + 2,0x80);
      t.tv_usec._4_4_ =
           select(maxfd + 1,(fd_set *)local_1a8,(fd_set *)(fdt[0].fds_bits + 0xf),
                  (fd_set *)(fdt[1].fds_bits + 0xf),(timeval *)local_20);
    }
  }
  else {
    t.tv_usec._4_4_ = 1;
  }
  return t.tv_usec._4_4_;
}

Assistant:

int fl_ready() {
  if (XQLength(fl_display)) return 1;
  if (!nfds) return 0; // nothing to select or poll
#  if USE_POLL
  return ::poll(pollfds, nfds, 0);
#  else
  timeval t;
  t.tv_sec = 0;
  t.tv_usec = 0;
  fd_set fdt[3];
  fdt[0] = fdsets[0];
  fdt[1] = fdsets[1];
  fdt[2] = fdsets[2];
  return ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],&t);
#  endif
}